

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O2

void * __thiscall
density::lifo_allocator<density::basic_default_allocator<65536UL>,_8UL>::allocate_slow_path
          (lifo_allocator<density::basic_default_allocator<65536UL>,_8UL> *this,size_t i_size)

{
  uintptr_t *puVar1;
  void *pvVar2;
  
  if (i_size < 0x7ff8) {
    puVar1 = (uintptr_t *)
             basic_default_allocator<65536UL>::allocate_page
                       ((basic_default_allocator<65536UL> *)this);
    *puVar1 = this->m_top;
    this->m_top = (long)puVar1 + i_size + 8;
    return puVar1 + 1;
  }
  pvVar2 = operator_new(i_size);
  return pvVar2;
}

Assistant:

DENSITY_NO_INLINE void * allocate_slow_path(size_t i_size)
        {
            DENSITY_ASSUME_UINT_ALIGNED(i_size, alignment);
            if (i_size < UNDERLYING_ALLOCATOR::page_size / 2)
            {
                // allocate a new page
                auto const new_page = UNDERLYING_ALLOCATOR::allocate_page();
                DENSITY_ASSUME(new_page != nullptr);
                auto const new_header   = new (new_page) PageHeader;
                new_header->m_prev_page = reinterpret_cast<void *>(m_top);
                m_top                   = reinterpret_cast<uintptr_t>(new_header + 1) + i_size;
                return new_header + 1;
            }
            else
            {
                // external block
                return UNDERLYING_ALLOCATOR::allocate(i_size, alignment);
            }
        }